

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrShadingContext.hpp
# Opt level: O0

Vector<float,_4> __thiscall
rr::readLineVarying<float>
          (rr *this,FragmentPacket *packet,FragmentShadingContext *context,int varyingLoc,
          int fragNdx)

{
  float fVar1;
  float *pfVar2;
  Vector<float,_4> VVar3;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  int local_28;
  int local_24;
  int fragNdx_local;
  int varyingLoc_local;
  FragmentShadingContext *context_local;
  FragmentPacket *packet_local;
  
  local_28 = fragNdx;
  local_24 = varyingLoc;
  _fragNdx_local = context;
  context_local = (FragmentShadingContext *)packet;
  packet_local = (FragmentPacket *)this;
  pfVar2 = tcu::Vector<float,_4>::operator[](packet->barycentric,fragNdx);
  fVar1 = *pfVar2;
  GenericVec4::get<float>((GenericVec4 *)&local_48);
  tcu::operator*((tcu *)&local_38,fVar1,&local_48);
  pfVar2 = tcu::Vector<float,_4>::operator[]
                     ((Vector<float,_4> *)&context_local->primitiveID,local_28);
  fVar1 = *pfVar2;
  GenericVec4::get<float>((GenericVec4 *)&local_68);
  tcu::operator*((tcu *)&local_58,fVar1,&local_68);
  VVar3 = tcu::operator+((tcu *)this,&local_38,&local_58);
  return (Vector<float,_4>)VVar3.m_data;
}

Assistant:

tcu::Vector<T, 4> readLineVarying (const FragmentPacket& packet, const FragmentShadingContext& context, int varyingLoc, int fragNdx)
{
	return   packet.barycentric[0][fragNdx] * context.varyings[0][varyingLoc].get<T>()
		   + packet.barycentric[1][fragNdx] * context.varyings[1][varyingLoc].get<T>();
}